

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_texture_multisample(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_texture_multisample != 0) {
    glad_glTexImage2DMultisampleCoverageNV =
         (PFNGLTEXIMAGE2DMULTISAMPLECOVERAGENVPROC)(*load)("glTexImage2DMultisampleCoverageNV");
    glad_glTexImage3DMultisampleCoverageNV =
         (PFNGLTEXIMAGE3DMULTISAMPLECOVERAGENVPROC)(*load)("glTexImage3DMultisampleCoverageNV");
    glad_glTextureImage2DMultisampleNV =
         (PFNGLTEXTUREIMAGE2DMULTISAMPLENVPROC)(*load)("glTextureImage2DMultisampleNV");
    glad_glTextureImage3DMultisampleNV =
         (PFNGLTEXTUREIMAGE3DMULTISAMPLENVPROC)(*load)("glTextureImage3DMultisampleNV");
    glad_glTextureImage2DMultisampleCoverageNV =
         (PFNGLTEXTUREIMAGE2DMULTISAMPLECOVERAGENVPROC)
         (*load)("glTextureImage2DMultisampleCoverageNV");
    glad_glTextureImage3DMultisampleCoverageNV =
         (PFNGLTEXTUREIMAGE3DMULTISAMPLECOVERAGENVPROC)
         (*load)("glTextureImage3DMultisampleCoverageNV");
  }
  return;
}

Assistant:

static void load_GL_NV_texture_multisample(GLADloadproc load) {
	if(!GLAD_GL_NV_texture_multisample) return;
	glad_glTexImage2DMultisampleCoverageNV = (PFNGLTEXIMAGE2DMULTISAMPLECOVERAGENVPROC)load("glTexImage2DMultisampleCoverageNV");
	glad_glTexImage3DMultisampleCoverageNV = (PFNGLTEXIMAGE3DMULTISAMPLECOVERAGENVPROC)load("glTexImage3DMultisampleCoverageNV");
	glad_glTextureImage2DMultisampleNV = (PFNGLTEXTUREIMAGE2DMULTISAMPLENVPROC)load("glTextureImage2DMultisampleNV");
	glad_glTextureImage3DMultisampleNV = (PFNGLTEXTUREIMAGE3DMULTISAMPLENVPROC)load("glTextureImage3DMultisampleNV");
	glad_glTextureImage2DMultisampleCoverageNV = (PFNGLTEXTUREIMAGE2DMULTISAMPLECOVERAGENVPROC)load("glTextureImage2DMultisampleCoverageNV");
	glad_glTextureImage3DMultisampleCoverageNV = (PFNGLTEXTUREIMAGE3DMULTISAMPLECOVERAGENVPROC)load("glTextureImage3DMultisampleCoverageNV");
}